

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::layoutChildren
          (AbstractScrollAreaPrivate *this,QStyleOption *opt)

{
  QWidget *pQVar1;
  BlurEffect *pBVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  QSize local_48;
  QSize local_40;
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  QRect viewportRect;
  QStyleOption *opt_local;
  AbstractScrollAreaPrivate *this_local;
  
  viewportRect._8_8_ = opt;
  auVar6 = QWidget::contentsRect();
  viewportRect._0_8_ = auVar6._8_8_;
  local_28 = auVar6._0_8_;
  bVar3 = QWidget::isRightToLeft((QWidget *)this->q);
  if (bVar3) {
    QRect::adjust((QRect *)local_28,this->right,this->top,-this->left,-this->bottom);
  }
  else {
    QRect::adjust((QRect *)local_28,this->left,this->top,-this->right,-this->bottom);
  }
  pQVar1 = this->viewport;
  local_38 = QStyle::visualRect(*(LayoutDirection *)(viewportRect._8_8_ + 0xc),
                                (QRect *)(viewportRect._8_8_ + 0x10),(QRect *)local_28);
  QWidget::setGeometry((QRect *)pQVar1);
  pBVar2 = this->horBlur;
  local_40 = (QSize)(**(code **)(*(long *)this->horBlur + 0x70))();
  iVar4 = QSize::width(&local_40);
  iVar5 = QRect::height((QRect *)local_28);
  QWidget::resize(&pBVar2->super_QWidget,iVar4,(int)((double)iVar5 * 0.75));
  pBVar2 = this->vertBlur;
  iVar4 = QRect::width((QRect *)local_28);
  local_48 = (QSize)(**(code **)(*(long *)this->vertBlur + 0x70))();
  iVar5 = QSize::height(&local_48);
  QWidget::resize(&pBVar2->super_QWidget,(int)((double)iVar4 * 0.75),iVar5);
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::layoutChildren( const QStyleOption & opt )
{
	QRect viewportRect = q->contentsRect();

	if( q->isRightToLeft() )
		viewportRect.adjust( right, top, -left, -bottom );
	else
		viewportRect.adjust( left, top, -right, -bottom );

	viewport->setGeometry( QStyle::visualRect( opt.direction, opt.rect,
		viewportRect ) );

	horBlur->resize( horBlur->sizeHint().width(),
		viewportRect.height() * 0.75 );

	vertBlur->resize( viewportRect.width() * 0.75,
		vertBlur->sizeHint().height() );
}